

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

int Pdr_InvCheck_int(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose,sat_solver *pSat,int fSkip)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  sat_solver *psVar9;
  lit *begin;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int local_60;
  
  piVar3 = vInv->pArray;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  iVar4 = sat_solver_nvars(pSat);
  iVar1 = p->nRegs;
  iVar2 = p->vCos->nSize;
  piVar5 = piVar3 + 1;
  if (0 < *piVar3) {
    iVar10 = 0;
    piVar6 = piVar5;
    do {
      p_00->nSize = 0;
      if (0 < *piVar6) {
        lVar12 = 0;
        do {
          uVar8 = piVar6[lVar12 + 1];
          if (uVar8 != 0xffffffff) {
            if ((int)uVar8 < 0) goto LAB_005e7437;
            iVar7 = (uVar8 >> 1) + (iVar4 - iVar1);
            if (iVar7 < 0) goto LAB_005e7418;
            Vec_IntPush(p_00,(uVar8 & 1) + iVar7 * 2 ^ 1);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < *piVar6);
      }
      begin = p_00->pArray;
      if ((long)p_00->nSize == 0) goto joined_r0x005e7270;
      iVar7 = sat_solver_addclause(pSat,begin,begin + p_00->nSize);
      if (iVar7 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x2dc,
                      "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
      }
      iVar10 = iVar10 + 1;
      piVar6 = piVar6 + (long)*piVar6 + 1;
    } while (iVar10 < *piVar3);
  }
  local_60 = 0;
  if (p->nRegs < p->vCos->nSize) {
    iVar4 = p_00->nCap;
    iVar10 = 2;
    uVar8 = 0;
    local_60 = 0;
    do {
      iVar7 = iVar4;
      if (iVar4 < 1) {
        if (p_00->pArray == (int *)0x0) {
          piVar6 = (int *)malloc(4);
        }
        else {
          piVar6 = (int *)realloc(p_00->pArray,4);
        }
        p_00->pArray = piVar6;
        iVar7 = 1;
        if (piVar6 == (int *)0x0) {
          p_00->nCap = iVar4;
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
      }
      iVar4 = iVar7;
      begin = p_00->pArray;
      *begin = iVar10;
      p_00->nSize = 1;
      psVar9 = pSat;
      iVar7 = sat_solver_solve(pSat,begin,begin + 1,0,0,0,0);
      if (iVar7 != -1) {
        if (iVar7 != 1) {
          if (iVar7 != 0) {
            p_00->nCap = iVar4;
            __assert_fail("status == l_False",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                          ,0x2f3,
                          "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
          }
          break;
        }
        if (fVerbose != 0) {
          Abc_Print((int)psVar9,"Coverage check failed for output %d.\n",(ulong)uVar8);
        }
        if (fSkip != 0) {
          p_00->nCap = iVar4;
          goto LAB_005e73ef;
        }
        local_60 = local_60 + 1;
      }
      uVar8 = uVar8 + 1;
      iVar10 = iVar10 + 2;
    } while ((int)uVar8 < p->vCos->nSize - p->nRegs);
    p_00->nCap = iVar4;
  }
  iVar4 = 0;
  if (0 < *piVar3) {
    uVar11 = 0;
    iVar4 = 0;
    do {
      p_00->nSize = 0;
      if (0 < *piVar5) {
        lVar12 = 0;
        do {
          uVar8 = piVar5[lVar12 + 1];
          if (uVar8 != 0xffffffff) {
            if ((int)uVar8 < 0) {
LAB_005e7437:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            iVar10 = (uVar8 >> 1) + (iVar2 - iVar1) + 1;
            if (iVar10 < 0) {
LAB_005e7418:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            Vec_IntPush(p_00,(uVar8 & 1) + iVar10 * 2);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < *piVar5);
      }
      begin = p_00->pArray;
      psVar9 = pSat;
      iVar10 = sat_solver_solve(pSat,begin,begin + p_00->nSize,0,0,0,0);
      iVar7 = (int)psVar9;
      if ((fVerbose != 0) && (iVar10 != 1)) {
        Abc_Print(iVar7,"Finished checking clause %d (out of %d)...\r",uVar11);
      }
      if (iVar10 != -1) {
        if (iVar10 != 1) {
          if (iVar10 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                          ,0x307,
                          "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
          }
          break;
        }
        if (fVerbose != 0) {
          Abc_Print(iVar7,"Inductiveness check failed for clause %d.\n",uVar11);
        }
        if (fSkip != 0) {
joined_r0x005e7270:
          if (begin != (lit *)0x0) {
LAB_005e73ef:
            free(begin);
            p_00->pArray = (int *)0x0;
          }
          free(p_00);
          return 1;
        }
        iVar4 = iVar4 + 1;
      }
      uVar8 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar8;
      piVar5 = piVar5 + (long)*piVar5 + 1;
    } while ((int)uVar8 < *piVar3);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return iVar4 + local_60;
}

Assistant:

int Pdr_InvCheck_int( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose, sat_solver * pSat, int fSkip )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    int i, k, status, nFailed = 0, nFailedOuts = 0; 
    // collect cubes
    int * pCube, * pList = Vec_IntArray(vInv);
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    int iFoVarBeg = sat_solver_nvars(pSat) - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    // add cubes
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        if ( Vec_IntSize(vLits) == 0 )
        {
            Vec_IntFree( vLits );
            return 1;
        }
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // verify property output
    if ( fCheckProperty )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
        {
            Vec_IntFill( vLits, 1, Abc_Var2Lit(1+i, 0) );
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
                break;
            if ( status == l_True ) // sat - property fails
            {
                if ( fVerbose )
                    Abc_Print(1, "Coverage check failed for output %d.\n", i );
                nFailedOuts++;
                if ( fSkip )
                {
                    Vec_IntFree( vLits );
                    return 1;
                }
                continue;
            }
            assert( status == l_False ); // unsat - property holds
        }
    }
    // iterate through cubes in the direct order
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect cube
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status != l_True && fVerbose )
            Abc_Print(1, "Finished checking clause %d (out of %d)...\r", i, pList[0] );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat -- correct
            continue;
        assert( status == l_True );
        if ( fVerbose )
            Abc_Print(1, "Inductiveness check failed for clause %d.\n", i );
        nFailed++;
        if ( fSkip )
        {
            Vec_IntFree( vLits );
            return 1;
        }
    }
    Vec_IntFree( vLits );
    return nFailed + nFailedOuts;
}